

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_comp_unit(SyntaxAnalyze *this)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  SyntaxAnalyze *in_RDI;
  undefined4 unaff_retaddr;
  Token unaff_retaddr_00;
  Token in_stack_00000008;
  int in_stack_0000000c;
  irGenerator *in_stack_000000d0;
  SyntaxAnalyze *in_stack_00000310;
  irGenerator *in_stack_00001520;
  SyntaxAnalyze *pSVar4;
  
  pSVar4 = in_RDI;
  hp_init_external_function(in_stack_00000310);
  irGenerator::irGenerator::ir_begin_of_program(in_stack_00001520);
  while (sVar1 = in_RDI->matched_index,
        sVar3 = std::vector<front::word::Word,_std::allocator<front::word::Word>_>::size
                          (in_RDI->word_list), sVar1 + 1 < sVar3) {
    bVar2 = try_word(this,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00);
    if (((bVar2) &&
        (bVar2 = try_word((SyntaxAnalyze *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                          (int)((ulong)pSVar4 >> 0x20),(Token)pSVar4), bVar2)) &&
       (bVar2 = try_word((SyntaxAnalyze *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                         (int)((ulong)pSVar4 >> 0x20),(Token)pSVar4), bVar2)) {
      gm_func_def(in_stack_00000310);
    }
    else {
      bVar2 = try_word((SyntaxAnalyze *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                       (int)((ulong)pSVar4 >> 0x20),(Token)pSVar4);
      if (bVar2) {
        gm_const_decl(in_RDI);
      }
      else {
        gm_var_decl(in_RDI);
      }
    }
  }
  irGenerator::irGenerator::ir_end_of_program(in_stack_000000d0);
  return;
}

Assistant:

void SyntaxAnalyze::gm_comp_unit() {
  hp_init_external_function();

  irGenerator.ir_begin_of_program();

  while (matched_index + 1 < word_list.size()) {
    if (try_word(1, Token::INTTK, Token::VOIDTK) &&
        try_word(2, Token::IDENFR) && try_word(3, Token::LPARENT)) {
      gm_func_def();
    } else if (try_word(1, Token::CONSTTK)) {
      gm_const_decl();
    } else {
      gm_var_decl();
    }
  }

  irGenerator.ir_end_of_program();
}